

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

void trie_iterate_recursive(trie t,trie_cb_iterate iterate_cb,trie_cb_iterate_args args)

{
  trie_node ptVar1;
  trie local_28;
  trie_cb_iterate local_20;
  trie_cb_iterate_args local_18;
  
  if (iterate_cb != (trie_cb_iterate)0x0 && t != (trie)0x0) {
    ptVar1 = t->root;
    if (ptVar1 != (trie_node)0x0) {
      local_28 = t;
      local_20 = iterate_cb;
      local_18 = args;
      (*iterate_cb)(t,ptVar1->key,ptVar1->value,args);
      set_iterate(ptVar1->childs,trie_node_childs_cb_iterator,&local_28);
    }
  }
  return;
}

Assistant:

void trie_iterate_recursive(trie t, trie_cb_iterate iterate_cb, trie_cb_iterate_args args)
{
	if (t != NULL && iterate_cb != NULL)
	{
		trie_node_iterate_recursive(t, t->root, iterate_cb, args);
	}
}